

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringReader.hpp
# Opt level: O3

void __thiscall StringReader::~StringReader(StringReader *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Readable)._vptr_Readable = (_func_int **)&PTR__StringReader_00130598;
  pcVar1 = (this->file)._M_dataplus._M_p;
  paVar2 = &(this->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~StringReader() override = default;